

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr
xmlCreateIOParserCtxt
          (xmlSAXHandlerPtr sax,void *user_data,xmlInputReadCallback ioread,
          xmlInputCloseCallback ioclose,void *ioctx,xmlCharEncoding enc)

{
  int iVar1;
  char *encoding_00;
  xmlParserInputPtr value;
  char *encoding;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlCharEncoding enc_local;
  void *ioctx_local;
  xmlInputCloseCallback ioclose_local;
  xmlInputReadCallback ioread_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  
  sax_local = (xmlSAXHandlerPtr)xmlNewSAXParserCtxt(sax,user_data);
  if ((xmlParserCtxtPtr)sax_local == (xmlParserCtxtPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    encoding_00 = xmlGetCharEncodingName(enc);
    value = xmlCtxtNewInputFromIO
                      ((xmlParserCtxtPtr)sax_local,(char *)0x0,ioread,ioclose,ioctx,encoding_00,0);
    if (value == (xmlParserInputPtr)0x0) {
      xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      iVar1 = xmlCtxtPushInput((xmlParserCtxtPtr)sax_local,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
    }
  }
  return (xmlParserCtxtPtr)sax_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreateIOParserCtxt(xmlSAXHandlerPtr sax, void *user_data,
                      xmlInputReadCallback ioread,
                      xmlInputCloseCallback ioclose,
                      void *ioctx, xmlCharEncoding enc) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    const char *encoding;

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL)
	return(NULL);

    encoding = xmlGetCharEncodingName(enc);
    input = xmlCtxtNewInputFromIO(ctxt, NULL, ioread, ioclose, ioctx,
                                  encoding, 0);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
        return (NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}